

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  float fVar1;
  uchar uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  StbUndoRecord *pSVar9;
  bool bVar10;
  ImWchar IVar11;
  short sVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  StbFindState *pSVar16;
  ImWchar *pIVar17;
  long lVar18;
  int iVar19;
  int *piVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  float fVar24;
  StbFindState find;
  StbTexteditRow row;
  
  state = &this->Stb;
  uVar2 = (this->Stb).single_line;
LAB_00359279:
  switch(key) {
  case 0x200000:
    goto switchD_0035928c_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    ImStb::stb_textedit_clamp(this,state);
    goto LAB_003599de;
  case 0x200002:
switchD_0035928c_caseD_200002:
    if (uVar2 == '\0') {
      if ((key & 0x400000U) == 0) {
        if ((this->Stb).select_start != (this->Stb).select_end) {
          ImStb::stb_textedit_move_to_first(state);
        }
      }
      else {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_find_charpos(&find,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
      if (find.prev_first == find.first_char) goto LAB_003599e2;
      pSVar16 = (StbFindState *)&(this->Stb).preferred_x;
      if ((this->Stb).has_preferred_x == '\0') {
        pSVar16 = &find;
      }
      fVar1 = pSVar16->x;
      (this->Stb).cursor = find.prev_first;
      ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,find.prev_first);
      iVar13 = 0;
      if (row.num_chars < 1) {
        row.num_chars = 0;
        iVar13 = 0;
      }
      goto LAB_00359846;
    }
    key = key & 0x400000U | 0x200000;
    goto LAB_00359279;
  case 0x200003:
switchD_0035928c_caseD_200003:
    if (uVar2 != '\0') goto code_r0x003592ca;
    if ((key & 0x400000U) == 0) {
      if ((this->Stb).select_start != (this->Stb).select_end) {
        ImStb::stb_textedit_move_to_last(this,state);
      }
    }
    else {
      ImStb::stb_textedit_prep_selection_at_cursor(state);
    }
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_find_charpos(&find,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
    if (find.length == 0) goto LAB_003599e2;
    pSVar16 = (StbFindState *)&(this->Stb).preferred_x;
    if ((this->Stb).has_preferred_x == '\0') {
      pSVar16 = &find;
    }
    fVar1 = pSVar16->x;
    iVar21 = find.length + find.first_char;
    (this->Stb).cursor = iVar21;
    ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,iVar21);
    iVar13 = 0;
    if (row.num_chars < 1) {
      row.num_chars = 0;
      iVar13 = 0;
    }
    goto LAB_00359786;
  case 0x200004:
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar13 = state->cursor;
      while ((0 < iVar13 && (IVar11 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar13 + -1), IVar11 != 10)))
      {
        iVar13 = state->cursor + -1;
        state->cursor = iVar13;
      }
    }
    else {
      state->cursor = 0;
    }
    goto LAB_003599de;
  case 0x200005:
    iVar13 = this->CurLenW;
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar21 = state->cursor;
      while ((iVar21 < iVar13 && (IVar11 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar21), IVar11 != 10)))
      {
        iVar21 = state->cursor + 1;
        state->cursor = iVar21;
      }
    }
    else {
      state->cursor = iVar13;
    }
    goto LAB_003599de;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_003599de;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_003599de;
  case 0x200008:
switchD_0035928c_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar13 = (this->Stb).cursor;
      if (iVar13 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar13,1);
      }
      goto LAB_003599de;
    }
    break;
  case 0x200009:
switchD_0035928c_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      ImStb::stb_textedit_clamp(this,state);
      iVar13 = (this->Stb).cursor;
      if (0 < iVar13) {
        ImStb::stb_textedit_delete(this,state,iVar13 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_003599de;
    }
    break;
  case 0x20000a:
    lVar18 = (long)(this->Stb).undostate.undo_point;
    if (lVar18 != 0) {
      iVar13 = (this->Stb).undostate.undo_rec[lVar18 + -1].where;
      iVar21 = (this->Stb).undostate.undo_rec[lVar18 + -1].insert_length;
      iVar5 = (this->Stb).undostate.undo_rec[lVar18 + -1].delete_length;
      iVar6 = (this->Stb).undostate.undo_rec[lVar18 + -1].char_storage;
      uVar15 = (ulong)(this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_rec[uVar15 - 1].char_storage = -1;
      (this->Stb).undostate.undo_rec[uVar15 - 1].insert_length = iVar5;
      (this->Stb).undostate.undo_rec[uVar15 - 1].delete_length = iVar21;
      (this->Stb).undostate.undo_rec[uVar15 - 1].where = iVar13;
      if (iVar5 != 0) {
        iVar19 = (this->Stb).undostate.undo_char_point;
        if (iVar19 + iVar5 < 999) {
          do {
            sVar12 = (short)uVar15;
            iVar22 = (this->Stb).undostate.redo_char_point;
            do {
              lVar18 = (long)sVar12;
              if (iVar19 + iVar5 <= iVar22) {
                piVar20 = &(this->Stb).undostate.undo_rec[lVar18 + -1].char_storage;
                *piVar20 = iVar22 - iVar5;
                (this->Stb).undostate.redo_char_point = iVar22 - iVar5;
                lVar18 = 0;
                iVar19 = 0;
                if (0 < iVar5) {
                  iVar19 = iVar5;
                }
                for (; iVar19 != (int)lVar18; lVar18 = lVar18 + 1) {
                  IVar11 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar13 + (int)lVar18);
                  (this->Stb).undostate.undo_char[*piVar20 + lVar18] = IVar11;
                }
                goto LAB_003596a5;
              }
              if (sVar12 == 99) goto LAB_003599de;
            } while (0x62 < sVar12);
            if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
              iVar19 = (this->Stb).undostate.undo_rec[0x62].insert_length;
              iVar22 = iVar22 + iVar19;
              (this->Stb).undostate.redo_char_point = iVar22;
              pIVar17 = (this->Stb).undostate.undo_char + iVar22;
              memmove(pIVar17,pIVar17 + -(long)iVar19,(long)(999 - iVar22) * 2);
              sVar12 = (this->Stb).undostate.redo_point;
              lVar18 = (long)sVar12;
              piVar20 = &(this->Stb).undostate.undo_rec[lVar18].char_storage;
              for (lVar23 = lVar18; lVar23 < 0x62; lVar23 = lVar23 + 1) {
                if (-1 < *piVar20) {
                  *piVar20 = *piVar20 + iVar19;
                }
                piVar20 = piVar20 + 4;
              }
            }
            if (sVar12 < 0) {
              __assert_fail("((char*)(state->undo_rec + state->redo_point)) >= buf_begin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/include/imstb_textedit.h"
                            ,0x475,"void ImStb::stb_textedit_discard_redo(StbUndoState *)");
            }
            memmove((this->Stb).undostate.undo_rec + lVar18 + 1,
                    (this->Stb).undostate.undo_rec + lVar18,lVar18 * -0x10 + 0x620);
            iVar19 = (this->Stb).undostate.undo_char_point;
            uVar14 = *(int *)&(this->Stb).undostate.redo_point + 1;
            uVar15 = (ulong)uVar14;
            (this->Stb).undostate.redo_point = (short)uVar14;
          } while( true );
        }
        (this->Stb).undostate.undo_rec[uVar15 - 1].insert_length = 0;
LAB_003596a5:
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar13,iVar5);
      }
      if (iVar21 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar13,(this->Stb).undostate.undo_char + iVar6,iVar21);
        piVar20 = &(this->Stb).undostate.undo_char_point;
        *piVar20 = *piVar20 - iVar21;
      }
      (this->Stb).cursor = iVar21 + iVar13;
      uVar4 = (this->Stb).undostate.undo_point;
      uVar8 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar4 + -1;
      (this->Stb).undostate.redo_point = uVar8 + -1;
    }
    goto LAB_003599de;
  case 0x20000b:
    lVar18 = (long)(this->Stb).undostate.redo_point;
    if (lVar18 != 99) {
      sVar12 = (this->Stb).undostate.undo_point;
      iVar13 = (this->Stb).undostate.undo_rec[lVar18].where;
      iVar21 = (this->Stb).undostate.undo_rec[lVar18].insert_length;
      iVar5 = (this->Stb).undostate.undo_rec[lVar18].delete_length;
      iVar6 = (this->Stb).undostate.undo_rec[lVar18].char_storage;
      (this->Stb).undostate.undo_rec[sVar12].delete_length = iVar21;
      (this->Stb).undostate.undo_rec[sVar12].insert_length = iVar5;
      (this->Stb).undostate.undo_rec[sVar12].where = iVar13;
      (this->Stb).undostate.undo_rec[sVar12].char_storage = -1;
      if (iVar5 != 0) {
        iVar22 = (this->Stb).undostate.undo_char_point;
        iVar19 = iVar22 + iVar5;
        if ((this->Stb).undostate.redo_char_point < iVar19) {
          pSVar9 = (this->Stb).undostate.undo_rec + sVar12;
          pSVar9->insert_length = 0;
          pSVar9->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar12].char_storage = iVar22;
          (this->Stb).undostate.undo_char_point = iVar19;
          iVar19 = iVar5;
          for (lVar18 = 0; (int)lVar18 < iVar19; lVar18 = lVar18 + 1) {
            IVar11 = ImStb::STB_TEXTEDIT_GETCHAR
                               (this,(this->Stb).undostate.undo_rec[sVar12].where + (int)lVar18);
            (this->Stb).undostate.undo_char
            [(this->Stb).undostate.undo_rec[sVar12].char_storage + lVar18] = IVar11;
            iVar19 = (this->Stb).undostate.undo_rec[sVar12].insert_length;
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar13,iVar5);
      }
      if (iVar21 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar13,(this->Stb).undostate.undo_char + iVar6,iVar21);
        piVar20 = &(this->Stb).undostate.redo_char_point;
        *piVar20 = *piVar20 + iVar21;
      }
      (this->Stb).cursor = iVar21 + iVar13;
      uVar3 = (this->Stb).undostate.undo_point;
      uVar7 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar3 + 1;
      (this->Stb).undostate.redo_point = uVar7 + 1;
    }
    goto LAB_003599de;
  case 0x20000c:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar13 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_003594e6;
    }
    ImStb::stb_textedit_move_to_first(state);
    goto LAB_003599e2;
  case 0x20000d:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar13 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_003594e6:
      (this->Stb).cursor = iVar13;
LAB_003594e9:
      ImStb::stb_textedit_clamp(this,state);
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    goto LAB_003599e2;
  default:
    switch(key) {
    case 0x600000:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar13 = (this->Stb).select_end;
      if (0 < iVar13) {
        iVar13 = iVar13 + -1;
        goto LAB_00359413;
      }
      break;
    case 0x600001:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      piVar20 = &(this->Stb).select_end;
      *piVar20 = *piVar20 + 1;
      ImStb::stb_textedit_clamp(this,state);
      iVar13 = (this->Stb).select_end;
      break;
    case 0x600002:
      goto switchD_0035928c_caseD_200002;
    case 0x600003:
      goto switchD_0035928c_caseD_200003;
    case 0x600004:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        iVar13 = state->cursor;
        goto LAB_00359994;
      }
      state->cursor = 0;
      iVar13 = 0;
      goto LAB_003593aa;
    case 0x600005:
      iVar13 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        iVar21 = state->cursor;
        goto LAB_003599bd;
      }
      state->cursor = iVar13;
      iVar21 = iVar13;
      goto LAB_003599db;
    case 0x600006:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      (this->Stb).select_end = 0;
      (this->Stb).cursor = 0;
      goto LAB_003599de;
    case 0x600007:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar13 = this->CurLenW;
LAB_00359413:
      (this->Stb).select_end = iVar13;
      break;
    case 0x600008:
      goto switchD_0035928c_caseD_200008;
    case 0x600009:
      goto switchD_0035928c_caseD_200009;
    default:
      uVar14 = 0;
      if (key < 0x10000) {
        uVar14 = key;
      }
      if (((int)uVar14 < 1) || (find.x._0_2_ = (undefined2)uVar14, uVar14 == 10 && uVar2 != '\0'))
      goto LAB_003599e2;
      if (((this->Stb).insert_mode == '\0') ||
         (((this->Stb).select_start != (this->Stb).select_end ||
          (iVar13 = (this->Stb).cursor, this->CurLenW <= iVar13)))) {
        ImStb::stb_textedit_delete_selection(this,state);
        bVar10 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)&find,1);
        if (!bVar10) goto LAB_003599e2;
        ImStb::stb_text_makeundo_insert(state,state->cursor,1);
      }
      else {
        pIVar17 = ImStb::stb_text_createundo(&(this->Stb).undostate,iVar13,1,1);
        if (pIVar17 != (ImWchar *)0x0) {
          IVar11 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar13);
          *pIVar17 = IVar11;
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar10 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)&find,1);
        if (!bVar10) goto LAB_003599e2;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_003599de;
    case 0x60000c:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar13 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_0035944e;
    case 0x60000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar13 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_0035944e:
      (this->Stb).cursor = iVar13;
      (this->Stb).select_end = iVar13;
      goto LAB_003594e9;
    }
    (this->Stb).cursor = iVar13;
    goto LAB_003599de;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_003599de;
LAB_003599bd:
  if (iVar13 <= iVar21) goto LAB_003599db;
  IVar11 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar21);
  iVar21 = (this->Stb).cursor;
  if (IVar11 == 10) goto LAB_003599db;
  iVar21 = iVar21 + 1;
  state->cursor = iVar21;
  goto LAB_003599bd;
LAB_003599db:
  (this->Stb).select_end = iVar21;
  goto LAB_003599de;
LAB_00359994:
  if (iVar13 < 1) goto LAB_003593aa;
  IVar11 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar13 + -1);
  iVar13 = (this->Stb).cursor;
  if (IVar11 == 10) goto LAB_003593aa;
  iVar13 = iVar13 + -1;
  state->cursor = iVar13;
  goto LAB_00359994;
LAB_003593aa:
  (this->Stb).select_end = iVar13;
  goto LAB_003599de;
code_r0x003592ca:
  key = key & 0x400000U | 0x200001;
  goto LAB_00359279;
LAB_00359786:
  if (row.num_chars == iVar13) goto LAB_00359881;
  fVar24 = ImStb::STB_TEXTEDIT_GETWIDTH(this,iVar21,iVar13);
  if (((fVar24 == -1.0) && (!NAN(fVar24))) || (row.x0 = row.x0 + fVar24, fVar1 < row.x0))
  goto LAB_00359881;
  state->cursor = state->cursor + 1;
  iVar13 = iVar13 + 1;
  goto LAB_00359786;
LAB_00359846:
  if (row.num_chars == iVar13) goto LAB_00359881;
  fVar24 = ImStb::STB_TEXTEDIT_GETWIDTH(this,find.prev_first,iVar13);
  if (((fVar24 == -1.0) && (!NAN(fVar24))) || (row.x0 = row.x0 + fVar24, fVar1 < row.x0))
  goto LAB_00359881;
  state->cursor = state->cursor + 1;
  iVar13 = iVar13 + 1;
  goto LAB_00359846;
LAB_00359881:
  ImStb::stb_textedit_clamp(this,state);
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar1;
  if ((key & 0x400000U) != 0) {
    (this->Stb).select_end = (this->Stb).cursor;
  }
  goto LAB_003599e2;
switchD_0035928c_caseD_200000:
  if ((this->Stb).select_start == (this->Stb).select_end) {
    if (0 < state->cursor) {
      state->cursor = state->cursor + -1;
    }
  }
  else {
    ImStb::stb_textedit_move_to_first(state);
  }
LAB_003599de:
  (this->Stb).has_preferred_x = '\0';
LAB_003599e2:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}